

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::Model::set_allocated_soundanalysispreprocessing
          (Model *this,SoundAnalysisPreprocessing *soundanalysispreprocessing)

{
  Arena *message_arena_00;
  Arena *submessage_arena_00;
  Arena *submessage_arena;
  Arena *message_arena;
  SoundAnalysisPreprocessing *soundanalysispreprocessing_local;
  Model *this_local;
  
  message_arena_00 = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
  clear_Type(this);
  if (soundanalysispreprocessing != (SoundAnalysisPreprocessing *)0x0) {
    submessage_arena_00 =
         google::protobuf::Arena::InternalHelper<google::protobuf::MessageLite>::GetOwningArena
                   (&soundanalysispreprocessing->super_MessageLite);
    message_arena = (Arena *)soundanalysispreprocessing;
    if (message_arena_00 != submessage_arena_00) {
      message_arena =
           (Arena *)google::protobuf::internal::
                    GetOwnedMessage<CoreML::Specification::CoreMLModels::SoundAnalysisPreprocessing>
                              (message_arena_00,soundanalysispreprocessing,submessage_arena_00);
    }
    set_has_soundanalysispreprocessing(this);
    (this->Type_).pipelineclassifier_ = (PipelineClassifier *)message_arena;
  }
  return;
}

Assistant:

void Model::set_allocated_soundanalysispreprocessing(::CoreML::Specification::CoreMLModels::SoundAnalysisPreprocessing* soundanalysispreprocessing) {
  ::PROTOBUF_NAMESPACE_ID::Arena* message_arena = GetArenaForAllocation();
  clear_Type();
  if (soundanalysispreprocessing) {
    ::PROTOBUF_NAMESPACE_ID::Arena* submessage_arena =
        ::PROTOBUF_NAMESPACE_ID::Arena::InternalHelper<
            ::PROTOBUF_NAMESPACE_ID::MessageLite>::GetOwningArena(
                reinterpret_cast<::PROTOBUF_NAMESPACE_ID::MessageLite*>(soundanalysispreprocessing));
    if (message_arena != submessage_arena) {
      soundanalysispreprocessing = ::PROTOBUF_NAMESPACE_ID::internal::GetOwnedMessage(
          message_arena, soundanalysispreprocessing, submessage_arena);
    }
    set_has_soundanalysispreprocessing();
    Type_.soundanalysispreprocessing_ = soundanalysispreprocessing;
  }
  // @@protoc_insertion_point(field_set_allocated:CoreML.Specification.Model.soundAnalysisPreprocessing)
}